

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_setconsttable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQRESULT SVar2;
  SQInteger SStack_20;
  SQObjectPtr o;
  
  o.super_SQObject._type = (v->_sharedstate->_consts).super_SQObject._type;
  o.super_SQObject._unVal = (SQObjectValue)(v->_sharedstate->_consts).super_SQObject._unVal.pTable;
  if ((o.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar2 = sq_setconsttable(v);
  if (SVar2 < 0) {
    SStack_20 = -1;
  }
  else {
    SQVM::Push(v,&o);
    SStack_20 = 1;
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return SStack_20;
}

Assistant:

static SQInteger base_setconsttable(HSQUIRRELVM v)
{
    SQObjectPtr o = _ss(v)->_consts;
    if(SQ_FAILED(sq_setconsttable(v))) return SQ_ERROR;
    v->Push(o);
    return 1;
}